

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::MatchesConversions
          (ParsedFormatBase *this,bool allow_ignored,
          initializer_list<absl::lts_20250127::FormatConversionCharSet> convs)

{
  pointer pCVar1;
  FormatConversionCharSet FVar2;
  char conv;
  ulong uVar3;
  FormatConversionCharSet FVar4;
  ulong uVar5;
  iterator pFVar6;
  int iVar7;
  byte bVar8;
  undefined7 in_register_00000031;
  ConversionItem *item;
  pointer pCVar9;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> used;
  uint local_7c;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78;
  undefined4 local_6c;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  uVar5 = convs._M_len;
  pFVar6 = convs._M_array;
  local_6c = (undefined4)CONCAT71(in_register_00000031,allow_ignored);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pCVar9 = (this->items_).
           super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->items_).
           super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pCVar9 == pCVar1) {
      bVar8 = local_68._M_element_count == uVar5 | (byte)local_6c;
LAB_0038a908:
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68);
      return (bool)bVar8;
    }
    iVar7 = 3;
    if (pCVar9->is_conversion == true) {
      local_7c = (pCVar9->conv).precision.value_;
      if ((int)local_7c < -1) {
        local_7c = ~local_7c;
        if ((local_7c <= uVar5) && ((pFVar6[(ulong)local_7c - 1] & kStar) != 0)) {
          local_78 = &local_68;
          std::
          _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                    ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_78,&local_7c,&local_78);
          goto LAB_0038a849;
        }
LAB_0038a865:
        iVar7 = 1;
      }
      else {
LAB_0038a849:
        local_7c = (pCVar9->conv).width.value_;
        if ((int)local_7c < -1) {
          local_7c = ~local_7c;
          if ((uVar5 < local_7c) || ((pFVar6[(ulong)local_7c - 1] & kStar) == 0)) goto LAB_0038a865;
          local_78 = &local_68;
          std::
          _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                    ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_78,&local_7c,&local_78);
        }
        uVar3 = (ulong)(pCVar9->conv).conv;
        if (uVar3 < 0x13) {
          conv = "csdiouxXfFeEgGaAnpv"[uVar3];
        }
        else {
          conv = '\0';
        }
        local_7c = (pCVar9->conv).arg_position;
        iVar7 = 1;
        if (((ulong)(long)(int)local_7c <= uVar5) &&
           (FVar2 = pFVar6[(long)(int)local_7c - 1], FVar4 = FormatConversionCharToConvInt(conv),
           (FVar4 & FVar2) != 0)) {
          local_78 = &local_68;
          std::
          _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                    ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_78,&local_7c,&local_78);
          iVar7 = 0;
        }
      }
    }
    if ((iVar7 != 3) && (iVar7 != 0)) {
      bVar8 = 0;
      goto LAB_0038a908;
    }
    pCVar9 = pCVar9 + 1;
  } while( true );
}

Assistant:

bool ParsedFormatBase::MatchesConversions(
    bool allow_ignored,
    std::initializer_list<FormatConversionCharSet> convs) const {
  std::unordered_set<int> used;
  auto add_if_valid_conv = [&](int pos, char c) {
    if (static_cast<size_t>(pos) > convs.size() ||
        !Contains(convs.begin()[pos - 1], c))
      return false;
    used.insert(pos);
    return true;
  };
  for (const ConversionItem &item : items_) {
    if (!item.is_conversion) continue;
    auto &conv = item.conv;
    if (conv.precision.is_from_arg() &&
        !add_if_valid_conv(conv.precision.get_from_arg(), '*'))
      return false;
    if (conv.width.is_from_arg() &&
        !add_if_valid_conv(conv.width.get_from_arg(), '*'))
      return false;
    if (!add_if_valid_conv(conv.arg_position,
                           FormatConversionCharToChar(conv.conv)))
      return false;
  }
  return used.size() == convs.size() || allow_ignored;
}